

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Acec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  FILE *pFVar5;
  Gia_Man_t *pGVar6;
  int *piVar7;
  long lVar8;
  char *pcVar9;
  Acec_ParCec_t ParsCec;
  Gia_Man_t *pGia0;
  Gia_Man_t *pGStack_50;
  Gia_Man_t *pGia1;
  char *pcStack_40;
  
  Acec_ManCecSetDefaultParams(&ParsCec);
  Extra_UtilGetoptReset();
LAB_0025e694:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"CTmdtbvh");
    iVar2 = globalUtilOptind;
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar9 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0025e7d5:
        Abc_Print(-1,pcVar9);
        goto LAB_0025e7df;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      ParsCec.nBTLimit = iVar1;
    }
    else {
      if (iVar1 != 0x54) {
        piVar7 = &ParsCec.fBooth;
        if ((((iVar1 != 0x62) && (piVar7 = &ParsCec.fDualOutput, iVar1 != 100)) &&
            (piVar7 = &ParsCec.fMiter, iVar1 != 0x6d)) &&
           (piVar7 = &ParsCec.fTwoOutput, iVar1 != 0x74)) {
          if (iVar1 != 0x76) {
            if (iVar1 == -1) {
              if (ParsCec.fMiter == 0) {
                if ((uint)(argc - globalUtilOptind) < 2) {
                  if (argc != globalUtilOptind) {
                    pcVar9 = argv[globalUtilOptind];
                    pcVar4 = pcVar9;
                    goto LAB_0025ea05;
                  }
                  pcVar9 = pAbc->pGia->pSpec;
                  if (pcVar9 != (char *)0x0) goto LAB_0025ea47;
                  pcVar9 = "File name is not given on the command line.\n";
                }
                else {
                  if (argc - globalUtilOptind == 2) {
                    pGia0 = (Gia_Man_t *)0x0;
                    pGStack_50 = (Gia_Man_t *)0x0;
                    pGia1 = (Gia_Man_t *)argv[globalUtilOptind];
                    pcStack_40 = (argv + globalUtilOptind)[1];
                    lVar8 = 0;
                    goto LAB_0025e98e;
                  }
                  pcVar9 = "Too many command-line arguments.\n";
                }
              }
              else if (globalUtilOptind == argc) {
                pGVar6 = pAbc->pGia;
                if (pGVar6 != (Gia_Man_t *)0x0) {
                  if (ParsCec.fDualOutput == 0) {
                    if (ParsCec.fTwoOutput == 0) {
                      if (ParsCec.fSilent == 0) {
                        Abc_Print(1,
                                  "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n"
                                  ,(ulong)(uint)ParsCec.nBTLimit);
                        pGVar6 = pAbc->pGia;
                      }
                      pGVar6 = Gia_ManDemiterToDual(pGVar6);
                      Gia_ManDemiterDual(pGVar6,&pGia0,&pGia1);
                      Gia_ManStop(pGVar6);
                    }
                    else {
                      if ((pGVar6->vCos->nSize - pGVar6->nRegs & 1U) != 0) {
                        pcVar9 = "The two-output miter should have an even number of outputs.\n";
                        goto LAB_0025ec8c;
                      }
                      if (ParsCec.fSilent == 0) {
                        Abc_Print(1,
                                  "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n"
                                  ,(ulong)(uint)ParsCec.nBTLimit);
                        pGVar6 = pAbc->pGia;
                      }
                      Gia_ManDemiterTwoWords(pGVar6,&pGia0,&pGia1);
                    }
                  }
                  else {
                    if ((pGVar6->vCos->nSize - pGVar6->nRegs & 1U) != 0) {
                      pcVar9 = "The dual-output miter should have an even number of outputs.\n";
                      goto LAB_0025ec8c;
                    }
                    if (ParsCec.fSilent == 0) {
                      Abc_Print(1,
                                "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                                ,(ulong)(uint)ParsCec.nBTLimit);
                      pGVar6 = pAbc->pGia;
                    }
                    Gia_ManDemiterDual(pGVar6,&pGia0,&pGia1);
                  }
                  iVar2 = Acec_Solve(pGia0,pGia1,&ParsCec);
                  pAbc->Status = iVar2;
                  Abc_FrameReplaceCex(pAbc,&pGia0->pCexComb);
                  Gia_ManStop(pGia0);
                  pGVar3 = pGia1;
                  goto LAB_0025ec79;
                }
                pcVar9 = "Abc_CommandAbc9Acec(): There is no AIG.\n";
              }
              else {
                pcVar9 = 
                "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n"
                ;
              }
LAB_0025ec8c:
              iVar2 = -1;
              goto LAB_0025e8f8;
            }
            goto LAB_0025e7df;
          }
          piVar7 = &ParsCec.fVerbose;
        }
        *(byte *)piVar7 = (byte)*piVar7 ^ 1;
        goto LAB_0025e694;
      }
      if (argc <= globalUtilOptind) {
        pcVar9 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0025e7d5;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      ParsCec.TimeLimit = iVar1;
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
LAB_0025e7df:
      iVar2 = -2;
      Abc_Print(-2,"usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n");
      Abc_Print(-2,"\t         combinational equivalence checking for arithmetic circuits\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)ParsCec.nBTLimit);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)ParsCec.TimeLimit);
      pcVar9 = "miter";
      if (ParsCec.fMiter == 0) {
        pcVar9 = "two circuits";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar9);
      pcVar4 = "yes";
      pcVar9 = "yes";
      if (ParsCec.fDualOutput == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (ParsCec.fTwoOutput == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using two-word miter [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (ParsCec.fBooth == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle working with Booth multipliers [default = %s]\n",pcVar9);
      if (ParsCec.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      pcVar9 = "\tfile2  : (optional) the file with the second network\n";
LAB_0025e8f8:
      Abc_Print(iVar2,pcVar9);
      return 1;
    }
  } while( true );
LAB_0025e9b6:
  pFVar5 = fopen((char *)pGVar6,"r");
  if (pFVar5 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pGVar6);
    pGVar6 = (Gia_Man_t *)
             Extra_FileGetSimilarName
                       ((char *)pGVar6,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    (&pGia1)[lVar8] = pGVar6;
    goto LAB_0025ebc0;
  }
  fclose(pFVar5);
  pGVar6 = Gia_AigerRead((char *)pGVar6,0,0,0);
  (&pGia0)[lVar8] = pGVar6;
  lVar8 = lVar8 + 1;
  if (pGVar6 == (Gia_Man_t *)0x0) goto LAB_0025ea9e;
  goto LAB_0025e98e;
LAB_0025ea05:
  if (*pcVar4 == '>') {
    *pcVar4 = '\\';
  }
  else if (*pcVar4 == '\0') {
    pFVar5 = fopen(pcVar9,"r");
    if (pFVar5 == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar9);
      pGVar6 = (Gia_Man_t *)
               Extra_FileGetSimilarName
                         (pcVar9,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0025ebc0:
      if (pGVar6 != (Gia_Man_t *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pGVar6);
      }
      pcVar9 = "\n";
      iVar2 = 1;
      iVar1 = iVar2;
    }
    else {
      fclose(pFVar5);
LAB_0025ea47:
      pGVar6 = Gia_AigerRead(pcVar9,0,0,0);
      if (pGVar6 != (Gia_Man_t *)0x0) {
        iVar2 = Acec_Solve(pAbc->pGia,pGVar6,&ParsCec);
        pAbc->Status = iVar2;
        Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
        Gia_ManStop(pGVar6);
        return 0;
      }
LAB_0025ea9e:
      pcVar9 = "Reading AIGER has failed.\n";
      iVar2 = -1;
      iVar1 = 0;
    }
    Abc_Print(iVar2,pcVar9);
    return iVar1;
  }
  pcVar4 = pcVar4 + 1;
  goto LAB_0025ea05;
LAB_0025e98e:
  pGVar3 = pGStack_50;
  pGVar6 = pGia0;
  if (lVar8 != 2) {
    pGVar6 = (&pGia1)[lVar8];
    pGVar3 = pGVar6;
    do {
      if (*(char *)&pGVar3->pName == '>') {
        *(char *)&pGVar3->pName = '\\';
      }
      else if (*(char *)&pGVar3->pName == '\0') goto LAB_0025e9b6;
      pGVar3 = (Gia_Man_t *)((long)&pGVar3->pName + 1);
    } while( true );
  }
  iVar2 = Acec_Solve(pGia0,pGStack_50,&ParsCec);
  pAbc->Status = iVar2;
  Abc_FrameReplaceCex(pAbc,&pGVar6->pCexComb);
  Gia_ManStop(pGVar6);
LAB_0025ec79:
  Gia_ManStop(pGVar3);
  return 0;
}

Assistant:

int Abc_CommandAbc9Acec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Acec_ParCec_t ParsCec, * pPars = &ParsCec;
    char ** pArgvNew;
    int c, nArgcNew;
    Acec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTmdtbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOutput ^= 1;
            break;
        case 't':
            pPars->fTwoOutput ^= 1;
            break;
        case 'b':
            pPars->fBooth ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->fMiter )
    {
        Gia_Man_t * pGia0, * pGia1, * pDual;
        if ( argc != globalUtilOptind )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n" );
            return 1;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): There is no AIG.\n" );
            return 1;
        }
        if ( pPars->fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterDual( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else if ( pPars->fTwoOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The two-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterTwoWords( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else // regular single- or multi-output miter
        {
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pDual = Gia_ManDemiterToDual( pAbc->pGia );
            Gia_ManDemiterDual( pDual, &pGia0, &pGia1 );
            Gia_ManStop( pDual );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        Abc_FrameReplaceCex( pAbc, &pGia0->pCexComb );
        Gia_ManStop( pGia0 );
        Gia_ManStop( pGia1 );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 || nArgcNew == 1 )
    {
        Gia_Man_t * pSecond;
        char * pTemp, * FileName = NULL;
        if ( nArgcNew == 0 )
        {
            FileName = pAbc->pGia->pSpec;
            if ( FileName == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
        }
        else // if ( nArgcNew == 1 )
        {
            FileName = pArgvNew[0];
            // fix the wrong symbol
            for ( pTemp = FileName; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName, "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
                if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
        }
        pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pSecond == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
        pAbc->Status = Acec_Solve( pAbc->pGia, pSecond, pPars );
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pSecond );
    }
    else if ( nArgcNew == 2 )
    {
        Gia_Man_t * pGias[2] = {NULL};  int i;
        char * pTemp, * FileName[2] = { pArgvNew[0], pArgvNew[1] };
        for ( i = 0; i < 2; i++ )
        {
            // fix the wrong symbol
            for ( pTemp = FileName[i]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName[i], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName[i] );
                if ( (FileName[i] = Extra_FileGetSimilarName( FileName[i], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName[i] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[i] = Gia_AigerRead( FileName[i], 0, 0, 0 );
            if ( pGias[i] == NULL )
            {
                Abc_Print( -1, "Reading AIGER has failed.\n" );
                return 0;
            }
        }
        pAbc->Status = Acec_Solve( pGias[0], pGias[1], pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pGias[0] );
        Gia_ManStop( pGias[1] );
    }
    else
    {
        Abc_Print( -1, "Too many command-line arguments.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         combinational equivalence checking for arithmetic circuits\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", pPars->fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", pPars->fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-t     : toggle using two-word miter [default = %s]\n", pPars->fTwoOutput? "yes":"no");
    Abc_Print( -2, "\t-b     : toggle working with Booth multipliers [default = %s]\n", pPars->fBooth? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    return 1;
}